

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpageranges.cpp
# Opt level: O0

QPageRanges QPageRanges::fromString(QString *ranges)

{
  bool bVar1;
  QString *this;
  qsizetype qVar2;
  QPageRangesPrivate *this_00;
  QPageRangesPrivate *in_RSI;
  QExplicitlySharedDataPointer<QPageRangesPrivate> in_RDI;
  long in_FS_OFFSET;
  int number;
  int number2;
  int number1;
  QString *item;
  QStringList *__range1;
  QPageRanges *newRanges;
  bool ok_1;
  bool ok;
  QStringList rangeItems;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList items;
  QList<QPageRanges::Range> intervals;
  undefined4 in_stack_fffffffffffffef8;
  CaseSensitivity in_stack_fffffffffffffefc;
  QList<QString> *in_stack_ffffffffffffff00;
  QString *in_stack_ffffffffffffff08;
  QExplicitlySharedDataPointer<QPageRangesPrivate> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar3;
  QChar local_7a;
  QList<QString> local_78;
  QChar local_5a;
  QString *local_58;
  QString *local_50;
  const_iterator local_48;
  QChar local_3a;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QPageRanges::Range>::QList((QList<QPageRanges::Range> *)0x54912d);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QChar::QChar<char16_t,_true>(&local_3a,L',');
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  QString::split((QChar)(char16_t)&local_38,(QFlags_conflict *)in_RSI,(uint)(ushort)local_3a.ucs);
  local_48.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = QList<QString>::begin(in_stack_ffffffffffffff00);
  local_50 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QString *)QList<QString>::end(in_stack_ffffffffffffff00);
  local_50 = local_58;
  bVar1 = QList<QString>::const_iterator::operator!=(&local_48,(const_iterator)local_58);
  if (bVar1) {
    this = QList<QString>::const_iterator::operator*(&local_48);
    bVar1 = QString::isEmpty((QString *)0x549266);
    if (bVar1) {
      QPageRanges((QPageRanges *)0x549276);
    }
    else {
      QChar::QChar<char16_t,_true>(&local_5a,L'-');
      bVar1 = QString::contains((QString *)in_stack_ffffffffffffff00,
                                (QChar)(char16_t)((ulong)in_stack_ffffffffffffff08 >> 0x30),
                                in_stack_fffffffffffffefc);
      if (bVar1) {
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QChar::QChar<char16_t,_true>(&local_7a,L'-');
        QFlags<Qt::SplitBehaviorFlags>::QFlags
                  ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffefc);
        QString::split((QChar)(char16_t)&local_78,(QFlags_conflict *)this,(uint)(ushort)local_7a.ucs
                      );
        qVar2 = QList<QString>::size(&local_78);
        if (qVar2 == 2) {
          QList<QString>::operator[]
                    (in_stack_ffffffffffffff00,
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          QString::toInt(this,(bool *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          QPageRanges((QPageRanges *)0x5493b1);
        }
        else {
          QPageRanges((QPageRanges *)0x54935e);
        }
        QList<QString>::~QList((QList<QString> *)0x54946d);
      }
      else {
        QString::toInt(in_stack_ffffffffffffff08,(bool *)in_stack_ffffffffffffff00,
                       in_stack_fffffffffffffefc);
        QPageRanges((QPageRanges *)0x5494ab);
      }
    }
  }
  else {
    uVar3 = 0;
    *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QPageRanges((QPageRanges *)0x549525);
    this_00 = (QPageRangesPrivate *)operator_new(0x20);
    QPageRangesPrivate::QPageRangesPrivate(this_00);
    QExplicitlySharedDataPointer<QPageRangesPrivate>::reset(in_stack_ffffffffffffff10,in_RSI);
    QExplicitlySharedDataPointer<QPageRangesPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageRangesPrivate> *)0x549555);
    QList<QPageRanges::Range>::operator=
              ((QList<QPageRanges::Range> *)this_00,
               (QList<QPageRanges::Range> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QExplicitlySharedDataPointer<QPageRangesPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageRangesPrivate> *)0x549573);
    QPageRangesPrivate::mergeIntervals
              ((QPageRangesPrivate *)CONCAT17(uVar3,in_stack_ffffffffffffff30));
  }
  QList<QString>::~QList((QList<QString> *)0x5495a8);
  QList<QPageRanges::Range>::~QList((QList<QPageRanges::Range> *)0x5495b5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QPageRangesPrivate>)
           (QExplicitlySharedDataPointer<QPageRangesPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QPageRanges QPageRanges::fromString(const QString &ranges)
{
    QList<Range> intervals;
    const QStringList items = ranges.split(u',');
    for (const QString &item : items) {
        if (item.isEmpty())
            return QPageRanges();

        if (item.contains(u'-')) {
            const QStringList rangeItems = item.split(u'-');
            if (rangeItems.size() != 2)
                return QPageRanges();

            bool ok;
            const int number1 = rangeItems[0].toInt(&ok);
            if (!ok)
                return QPageRanges();

            const int number2 = rangeItems[1].toInt(&ok);
            if (!ok)
                return QPageRanges();

            if (number1 < 1 || number2 < 1 || number2 < number1)
                return QPageRanges();

            intervals.append({number1, number2});

        } else {
            bool ok;
            const int number = item.toInt(&ok);
            if (!ok)
                return QPageRanges();

            if (number < 1)
                return QPageRanges();

            intervals.append({number, number});
        }
    }

    QPageRanges newRanges;
    newRanges.d.reset(new QPageRangesPrivate);
    newRanges.d->intervals = intervals;
    newRanges.d->mergeIntervals();
    return newRanges;
}